

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::BaseLineTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BaseLineTestInstance *this)

{
  size_type *psVar1;
  deUint32 width;
  size_t **ppsVar2;
  undefined1 auVar3 [8];
  pointer pSVar4;
  pointer pSVar5;
  bool bVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  pointer pVVar10;
  ulong *puVar11;
  ulong uVar12;
  float extraout_XMM0_Da;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  string iterationDescription;
  ScopedLogSection section;
  IVec4 colorBits;
  pointer local_268;
  pointer pSStack_260;
  pointer local_258 [2];
  Surface local_248;
  long lStack_230;
  undefined1 local_228 [24];
  long lStack_210;
  string local_200;
  ScopedLogSection local_1e0;
  RasterizationArguments local_1d8;
  undefined4 uStack_1c4;
  long local_1b8;
  int local_1b0;
  undefined1 local_1a8 [8];
  pointer pSStack_1a0;
  pointer local_198 [12];
  ios_base local_138 [8];
  ios_base local_130 [264];
  
  iVar7 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<((ostringstream *)local_1a8,iVar7 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_268,0,(char *)0x0,0xb21970);
  pVVar10 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pVVar10) {
    local_228._16_8_ = *(undefined8 *)pVVar10->m_data;
    lStack_210 = plVar8[3];
    local_228._0_8_ = (pointer)(local_228 + 0x10);
  }
  else {
    local_228._16_8_ = *(undefined8 *)pVVar10->m_data;
    local_228._0_8_ = (pointer)*plVar8;
  }
  local_228._8_8_ = plVar8[1];
  *plVar8 = (long)pVVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_228);
  ppsVar2 = (size_t **)&local_248.m_pixels.m_cap;
  puVar11 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar11) {
    local_248.m_pixels.m_cap = *puVar11;
    lStack_230 = plVar8[3];
    local_248._0_8_ = ppsVar2;
  }
  else {
    local_248.m_pixels.m_cap = *puVar11;
    local_248._0_8_ = (ulong *)*plVar8;
  }
  local_248.m_pixels.m_ptr = (void *)plVar8[1];
  *plVar8 = (long)puVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ostream::operator<<(local_1a8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar12 = 0xf;
  if ((size_t **)local_248._0_8_ != ppsVar2) {
    uVar12 = local_248.m_pixels.m_cap;
  }
  if (uVar12 < (ulong)(local_1d8._8_8_ + (long)local_248.m_pixels.m_ptr)) {
    uVar12 = 0xf;
    if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
      uVar12 = CONCAT44(uStack_1c4,local_1d8.blueBits);
    }
    if ((ulong)(local_1d8._8_8_ + (long)local_248.m_pixels.m_ptr) <= uVar12) {
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d8,0,(char *)0x0,local_248._0_8_);
      goto LAB_0079cb5c;
    }
  }
  puVar9 = (undefined8 *)
           std::__cxx11::string::_M_append
                     ((char *)&local_248,
                      (ulong)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples));
LAB_0079cb5c:
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar1 = puVar9 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200.field_2._8_8_ = puVar9[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar1;
    local_200._M_dataplus._M_p = (pointer)*puVar9;
  }
  local_200._M_string_length = puVar9[1];
  *puVar9 = psVar1;
  puVar9[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((int *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples) != &local_1d8.blueBits) {
    operator_delete((undefined1 *)CONCAT44(local_1d8.subpixelBits,local_1d8.numSamples),
                    CONCAT44(uStack_1c4,local_1d8.blueBits) + 1);
  }
  if ((size_t **)local_248._0_8_ != ppsVar2) {
    operator_delete((void *)local_248._0_8_,local_248.m_pixels.m_cap + 1);
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  if (local_268 != (pointer)local_258) {
    operator_delete(local_268,(long)local_258[0] + 1);
  }
  tcu::ScopedLogSection::ScopedLogSection
            (&local_1e0,
             ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
             m_log,&local_200,&local_200);
  (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[3])(this);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&local_248,width,width);
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_258[0] = (pointer)0x0;
  local_268 = (pointer)0x0;
  pSStack_260 = (pointer)0x0;
  if (extraout_XMM0_Da <= this->m_maxLineWidth) {
    (*(this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance[7])
              (this,(ulong)(uint)this->m_iteration,local_228,&local_268);
    BaseRenderingTestInstance::drawPrimitives
              (&this->super_BaseRenderingTestInstance,&local_248,
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
               this->m_primitiveTopology);
    local_1a8 = (undefined1  [8])0x0;
    pSStack_1a0 = (pointer)0x0;
    local_198[0] = (pointer)0x0;
    tcu::getTextureFormatBitDepth
              ((tcu *)&local_1b8,&(this->super_BaseRenderingTestInstance).m_textureFormat);
    pSVar5 = local_198[0];
    pSVar4 = pSStack_1a0;
    auVar3 = local_1a8;
    local_1d8.numSamples = (int)((this->super_BaseRenderingTestInstance).m_multisampling != 0);
    local_1d8.subpixelBits = (this->super_BaseRenderingTestInstance).m_subpixelBits;
    local_1d8.redBits = (undefined4)local_1b8;
    local_1d8.greenBits = local_1b8._4_4_;
    local_1d8.blueBits = local_1b0;
    local_198[0] = local_258[0];
    local_1a8 = (undefined1  [8])local_268;
    pSStack_1a0 = pSStack_260;
    local_268 = (pointer)auVar3;
    pSStack_260 = pSVar4;
    local_258[0] = pSVar5;
    bVar6 = tcu::verifyClippedTriangulatedLineGroupRasterization
                      (&local_248,(LineSceneSpec *)local_1a8,&local_1d8,
                       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                       m_testCtx->m_log);
    if (!bVar6) {
      this->m_allIterationsPassed = false;
    }
    if (local_1a8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_1a8,(long)local_198[0] - (long)local_1a8);
    }
  }
  else {
    local_1a8 = (undefined1  [8])
                ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->
                m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1a0,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)extraout_XMM0_Da);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pSStack_1a0," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1a0);
    std::ios_base::~ios_base(local_130);
  }
  iVar7 = this->m_iteration + 1;
  this->m_iteration = iVar7;
  if (iVar7 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"Pass","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8,
                 (long)pSStack_1a0->positions[0].m_data + (long)local_1a8);
    }
    else {
      local_1a8 = (undefined1  [8])local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"Incorrect rasterization","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_1a8,
                 (long)pSStack_1a0->positions[0].m_data + (long)local_1a8);
    }
    if (local_1a8 != (undefined1  [8])local_198) {
      operator_delete((void *)local_1a8,(ulong)((long)local_198[0]->positions[0].m_data + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if (local_268 != (pointer)0x0) {
    operator_delete(local_268,(long)local_258[0] - (long)local_268);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  tcu::Surface::~Surface(&local_248);
  tcu::TestLog::endSection(local_1e0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BaseLineTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// gen data
		generateLines(m_iteration, drawBuffer, lines);

		// draw image
		drawPrimitives(resultImage, drawBuffer, m_primitiveTopology);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;


			tcu::IVec4				colorBits = tcu::getTextureFormatBitDepth(getTextureFormat());

			args.numSamples		= m_multisampling ? 1 : 0;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= colorBits[0];
			args.greenBits		= colorBits[1];
			args.blueBits		= colorBits[2];

			scene.lines.swap(lines);
			scene.lineWidth = lineWidth;

			if (!verifyClippedTriangulatedLineGroupRasterization(resultImage, scene, args, m_context.getTestContext().getLog()))
				m_allIterationsPassed = false;
		}
	}
	else
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Incorrect rasterization");
	}
	else
		return tcu::TestStatus::incomplete();
}